

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * openFile(string *filename)

{
  _Ios_Openmode in_ESI;
  string x;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  std::ifstream::ifstream(filename);
  std::ifstream::open((string *)filename,in_ESI);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"");
  if ((*(byte *)((long)&filename[1]._M_dataplus._M_p +
                *(long *)((filename->_M_dataplus)._M_p + -0x18)) & 5) == 0) {
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
    return filename;
  }
  std::operator<<((ostream *)&std::cout,"Unable to open file");
  exit(1);
}

Assistant:

ifstream openFile(string filename){
    ifstream inFile;
    inFile.open(filename);
    string x = "";

    if (!inFile) {
        cout << "Unable to open file";
        exit(1); // terminate with error
    }
    return inFile;
}